

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_signalfd_epoll.c
# Opt level: O1

void copy_fd(int in,int out)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  char buff [1024];
  int aiStack_570 [30];
  code *pcStack_4f8;
  code *pcStack_4f0;
  code *pcStack_4e8;
  itimerval iStack_4d8;
  sigset_t sStack_4b8;
  ulong uStack_438;
  undefined1 *puStack_430;
  char acStack_418 [1024];
  
  pcVar5 = acStack_418;
  memset(acStack_418,0,0x400);
  sVar2 = read(in,acStack_418,0x3ff);
  if ((int)sVar2 == 0) {
    return;
  }
  if ((int)sVar2 != -1) {
    __n = strlen(acStack_418);
    write(out,acStack_418,__n);
    return;
  }
  copy_fd_cold_1();
  uStack_438 = (ulong)(uint)out;
  if (in < 2) {
    pcStack_4e8 = (code *)0x1014c7;
    puStack_430 = acStack_418;
    puts("No alarm set. Will default to 5 seconds.");
    lVar4 = 5;
  }
  else {
    lVar4 = 0;
    puStack_430 = acStack_418;
  }
  pcStack_4e8 = (code *)0x1014d1;
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (in < 2) {
LAB_00101516:
    pcStack_4e8 = (code *)0x101523;
    sigemptyset(&sStack_4b8);
    pcStack_4e8 = (code *)0x101530;
    sigaddset(&sStack_4b8,0xe);
    pcStack_4e8 = (code *)0x10153d;
    sigaddset(&sStack_4b8,3);
    pcStack_4e8 = (code *)0x101549;
    iVar1 = sigprocmask(0,&sStack_4b8,(sigset_t *)0x0);
    if (iVar1 == -1) {
      pcStack_4e8 = (code *)0x1015c3;
      setup_signals_cold_4();
LAB_001015c3:
      pcStack_4e8 = (code *)0x1015c8;
      setup_signals_cold_3();
    }
    else {
      pcStack_4e8 = (code *)0x10155f;
      sfd = signalfd(-1,&sStack_4b8,0);
      if (sfd == -1) goto LAB_001015c3;
      iStack_4d8.it_interval.tv_usec = 0;
      iStack_4d8.it_value.tv_usec = 0;
      pcStack_4e8 = (code *)0x101592;
      iStack_4d8.it_interval.tv_sec = lVar4;
      iStack_4d8.it_value.tv_sec = lVar4;
      iVar1 = setitimer(ITIMER_REAL,&iStack_4d8,(itimerval *)0x0);
      if (iVar1 != -1) {
        return;
      }
    }
    pcStack_4e8 = (code *)0x1015cd;
    setup_signals_cold_2();
  }
  else {
    pcStack_4e8 = (code *)0x1014ef;
    lVar4 = strtol(*(char **)(pcVar5 + 8),(char **)0x0,10);
    if (*piVar3 == 0) {
      if (lVar4 == 0) {
        puts("No alarm set. Will default to 5 seconds.");
        return;
      }
      pcStack_4e8 = (code *)0x101516;
      printf("Alarm set every %ld seconds.\n",lVar4);
      goto LAB_00101516;
    }
  }
  pcStack_4e8 = setup_epoll;
  setup_signals_cold_1();
  iVar1 = 0;
  pcStack_4f0 = (code *)0x1015da;
  epollfd = epoll_create1(0);
  if (epollfd != -1) {
    return;
  }
  pcStack_4f0 = add_fd_to_epoll;
  setup_epoll_cold_1();
  ev.events = 1;
  pcStack_4f8 = (code *)0x101616;
  ev.data.fd = iVar1;
  iVar1 = epoll_ctl(epollfd,1,iVar1,(epoll_event *)&ev);
  if (iVar1 != -1) {
    return;
  }
  pcStack_4f8 = handle_signals;
  add_fd_to_epoll_cold_1();
  sVar2 = read(sfd,aiStack_570,0x80);
  if (sVar2 == -1) {
    handle_signals_cold_1();
LAB_00101673:
    puts("Got SIGQUIT. Will exit.");
    exit(0);
  }
  if (aiStack_570[0] == 0xe) {
    pcVar5 = "Got SIGALRM via SignalFD.";
  }
  else {
    if (aiStack_570[0] == 3) goto LAB_00101673;
    pcVar5 = "Got unexpected signal!";
  }
  puts(pcVar5);
  return;
}

Assistant:

void copy_fd(int in, int out) {
    char buff[1024];
    int bytes_read;

    bzero(buff, sizeof(buff));
    bytes_read = read(in, buff, sizeof(buff)-1 );
    if (bytes_read == -1)
        handle_error("read");
    else if (bytes_read == 0)
        return;
    write(out, buff, strlen(buff));
}